

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr.h
# Opt level: O0

int32_t * xdr_inline_encode(XDR *xdrs,size_t count)

{
  uint8_t *future;
  int32_t *buf;
  size_t count_local;
  XDR *xdrs_local;
  
  xdrs_local = (XDR *)xdrs->x_data;
  if ((xdrs->x_v).vio_wrap < xdrs->x_data + count) {
    xdrs_local = (XDR *)0x0;
  }
  else {
    xdrs->x_data = xdrs->x_data + count;
    xdr_tail_update(xdrs);
  }
  return (int32_t *)xdrs_local;
}

Assistant:

static inline int32_t *
xdr_inline_encode(XDR *xdrs, size_t count)
{
	int32_t *buf = (int32_t *)xdrs->x_data;
	uint8_t *future = xdrs->x_data + count;

	if (future <= xdrs->x_v.vio_wrap) {
		xdrs->x_data = future;
		xdr_tail_update(xdrs);
		return (buf);
	}
	return (NULL);
}